

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

FILE * fopen_or_fail(string *file_name,char *mode)

{
  char *__filename;
  FILE *pFVar1;
  undefined8 uVar2;
  char *in_RSI;
  FILE *out_file;
  
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,in_RSI);
  if (pFVar1 == (FILE *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    quit("opening output file %s failed",uVar2);
  }
  return (FILE *)pFVar1;
}

Assistant:

FILE* fopen_or_fail(std::string file_name, const char* mode)
{
    FILE* out_file = fopen(file_name.c_str(), mode);
    if (!out_file) {
        quit("opening output file %s failed", file_name.c_str());
    }
    return out_file;
}